

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool readSolutionFileKeywordLineOk(string *keyword,ifstream *in_file)

{
  uint uVar1;
  
  uVar1 = *(uint *)(&(in_file->super_basic_istream<char,_std::char_traits<char>_>).field_0x20 +
                   (long)(in_file->super_basic_istream<char,_std::char_traits<char>_>).
                         _vptr_basic_istream[-3]);
  if ((uVar1 & 2) == 0) {
    std::operator>>(&in_file->super_basic_istream<char,_std::char_traits<char>_>,(string *)keyword);
  }
  return (uVar1 & 2) == 0;
}

Assistant:

bool readSolutionFileKeywordLineOk(std::string& keyword,
                                   std::ifstream& in_file) {
  if (in_file.eof()) return false;
  in_file >> keyword;
  return true;
}